

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetInstallNameDirForBuildTree
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  bool bVar4;
  string *psVar5;
  string installPrefix;
  string local_70;
  string local_50;
  
  pcVar2 = this->Makefile;
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"CMAKE_PLATFORM_HAS_INSTALLNAME","");
  bVar4 = cmMakefile::IsOn(pcVar2,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    bVar4 = MacOSXUseInstallNameDir(this);
    if (bVar4) {
      pcVar2 = this->Makefile;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_INSTALL_PREFIX","")
      ;
      psVar5 = cmMakefile::GetSafeDefinition(pcVar2,&local_50);
      pcVar3 = (psVar5->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,pcVar3 + psVar5->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      GetInstallNameDirForInstallTree(__return_storage_ptr__,this,config,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == paVar1) {
        return __return_storage_ptr__;
      }
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
    bVar4 = CanGenerateInstallNameDir(this,INSTALL_NAME_FOR_BUILD);
    if (bVar4) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      bVar4 = MacOSXRpathInstallNameDirDefault(this);
      if (bVar4) {
        std::__cxx11::string::_M_replace
                  ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
                   0x798fd7);
      }
      else {
        GetDirectory(&local_70,this,config,RuntimeBinaryArtifact);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetInstallNameDirForBuildTree(
  const std::string& config) const
{
  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {

    // If building directly for installation then the build tree install_name
    // is the same as the install tree.
    if (this->MacOSXUseInstallNameDir()) {
      std::string installPrefix =
        this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
      return this->GetInstallNameDirForInstallTree(config, installPrefix);
    }

    // Use the build tree directory for the target.
    if (this->CanGenerateInstallNameDir(INSTALL_NAME_FOR_BUILD)) {
      std::string dir;
      if (this->MacOSXRpathInstallNameDirDefault()) {
        dir = "@rpath";
      } else {
        dir = this->GetDirectory(config);
      }
      dir += "/";
      return dir;
    }
  }
  return "";
}